

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLoadsXYZnode.cpp
# Opt level: O2

void __thiscall
chrono::ChLoadXYZnodeXYZnode::ChLoadXYZnodeXYZnode
          (ChLoadXYZnodeXYZnode *this,shared_ptr<chrono::ChNodeXYZ> *mnodeA,
          shared_ptr<chrono::ChNodeXYZ> *mnodeB)

{
  double dVar1;
  __shared_ptr<chrono::ChLoadable,(__gnu_cxx::_Lock_policy)2> local_40 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_38;
  __shared_ptr<chrono::ChLoadable,(__gnu_cxx::_Lock_policy)2> local_30 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_28;
  
  std::__shared_ptr<chrono::ChLoadable,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<chrono::ChNodeXYZ,void>
            (local_30,&mnodeA->super___shared_ptr<chrono::ChNodeXYZ,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<chrono::ChLoadable,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<chrono::ChNodeXYZ,void>
            (local_40,&mnodeB->super___shared_ptr<chrono::ChNodeXYZ,_(__gnu_cxx::_Lock_policy)2>);
  ChLoadCustomMultiple::ChLoadCustomMultiple
            (&this->super_ChLoadCustomMultiple,(shared_ptr<chrono::ChLoadable> *)local_30,
             (shared_ptr<chrono::ChLoadable> *)local_40);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_38);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_28);
  (this->super_ChLoadCustomMultiple).super_ChLoadBase.super_ChObj._vptr_ChObj =
       (_func_int **)&PTR__ChLoadCustomMultiple_0116d4c8;
  (this->computed_abs_force).m_data[2] = 0.0;
  (this->computed_abs_force).m_data[0] = 0.0;
  (this->computed_abs_force).m_data[1] = 0.0;
  dVar1 = DAT_011dd3e0;
  if (this != (ChLoadXYZnodeXYZnode *)Q_FLIP_AROUND_X) {
    (this->computed_abs_force).m_data[0] = VNULL;
    (this->computed_abs_force).m_data[1] = dVar1;
    (this->computed_abs_force).m_data[2] = DAT_011dd3e8;
  }
  return;
}

Assistant:

ChLoadXYZnodeXYZnode::ChLoadXYZnodeXYZnode(std::shared_ptr<ChNodeXYZ> mnodeA,  
										   std::shared_ptr<ChNodeXYZ> mnodeB)
    : ChLoadCustomMultiple(mnodeA, mnodeB)
{
	computed_abs_force = VNULL;
}